

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void handle_child_message(sockaddr_in addr_from)

{
  sockaddr_in addr_00;
  int iVar1;
  FILE *__stream;
  uchar auVar2 [8];
  uint32_t uVar3;
  undefined8 uVar4;
  Ip_Port IVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  sockaddr_in addr_01;
  mapped_type local_46c;
  Ip_Port IStack_468;
  int id_chld;
  sockaddr_in sStack_460;
  key_type local_450;
  Ip_Port ip_port;
  string local_438 [32];
  Ip_Port IStack_418;
  sockaddr_in addr;
  char str_addr [1000];
  size_t size_addr;
  sockaddr_in addr_from_local;
  
  uVar3 = ntohl(*(uint32_t *)((long)buf + 8));
  strncpy((char *)addr.sin_zero,(char *)((long)buf + 0xc),(ulong)uVar3);
  IVar5 = addr_from._0_8_;
  auVar2 = addr_from.sin_zero;
  if (addr.sin_zero[0] != '0') {
    addr.sin_zero[uVar3] = '\0';
    parse_address((char *)addr.sin_zero,(sockaddr_in *)&IStack_418);
    IVar5 = IStack_418;
    auVar2 = (uchar  [8])addr._0_8_;
  }
  addr._0_8_ = auVar2;
  IStack_418 = IVar5;
  __stream = _stderr;
  ip_port = IStack_418;
  addr_01.sin_zero = (uchar  [8])IStack_418;
  addr_01._0_8_ = local_438;
  pack_address_abi_cxx11_(addr_01);
  uVar4 = std::__cxx11::string::c_str();
  fprintf(__stream,"Receive child with address: %s\n",uVar4);
  std::__cxx11::string::~string(local_438);
  IStack_468 = IStack_418;
  sStack_460.sin_family = addr.sin_family;
  sStack_460.sin_port = addr.sin_port;
  sStack_460.sin_addr.s_addr = addr.sin_addr.s_addr;
  addr_00.sin_zero = (uchar  [8])addr._0_8_;
  addr_00._0_8_ = IStack_418;
  IVar5 = get_ip_port(addr_00);
  local_450.first = IVar5.first;
  local_450.second = IVar5.second;
  sVar6 = std::
          map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::count(&idconnections,&local_450);
  iVar1 = global_map_id;
  if (sVar6 == 0) {
    pmVar7 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_450);
    *pmVar7 = iVar1;
    pmVar8 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&global_map_id);
    *(Ip_Port *)pmVar8 = IStack_418;
    *(undefined8 *)pmVar8->sin_zero = addr._0_8_;
    global_map_id = global_map_id + 1;
  }
  pmVar7 = std::
           map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
           ::operator[](&idconnections,&local_450);
  local_46c = *pmVar7;
  sVar9 = std::set<int,_std::less<int>,_std::allocator<int>_>::count(&children,&local_46c);
  if (sVar9 == 0) {
    fprintf(_stderr,"Insert this new child to set\n");
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&children,&local_46c);
  }
  return;
}

Assistant:

void handle_child_message(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }
    fprintf(stderr, "Receive child with address: %s\n", pack_address(addr).c_str());

    Ip_Port ip_port = get_ip_port(addr);
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        ++global_map_id;
    }

    int id_chld = idconnections[ip_port];
    if (!children.count(id_chld)) {
        fprintf(stderr, "Insert this new child to set\n");
        children.insert(id_chld);
    }
}